

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::
ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
::reserve(ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *this,size_t minSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long *plVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  uVar11 = this->numAllocated;
  if (uVar11 < minSize) {
    uVar9 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar9 != 0) {
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new__(uVar9 << 5);
      if (this->numActive != 0) {
        lVar10 = 0x10;
        uVar11 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10);
          pbVar3 = this->items;
          puVar2 = (undefined8 *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10);
          *(undefined8 **)((long)pbVar7 + lVar10 + -0x10) = puVar1;
          puVar4 = *(undefined8 **)((long)pbVar3 + lVar10 + -0x10);
          if (puVar2 == puVar4) {
            uVar6 = puVar2[1];
            *puVar1 = *puVar2;
            puVar1[1] = uVar6;
          }
          else {
            *(undefined8 **)((long)pbVar7 + lVar10 + -0x10) = puVar4;
            *(undefined8 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10) = *puVar2;
          }
          *(undefined8 *)((long)pbVar7 + lVar10 + -8) = *(undefined8 *)((long)pbVar3 + lVar10 + -8);
          *(undefined8 **)((long)pbVar3 + lVar10 + -0x10) = puVar2;
          *(undefined8 *)((long)pbVar3 + lVar10 + -8) = 0;
          *(undefined1 *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10) = 0;
          plVar5 = *(long **)((long)this->items + lVar10 + -0x10);
          plVar8 = (long *)((long)&(this->items->_M_dataplus)._M_p + lVar10);
          if (plVar8 != plVar5) {
            operator_delete(plVar5,*plVar8 + 1);
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar11 < this->numActive);
        uVar11 = this->numAllocated;
      }
      if ((8 < uVar11) &&
         (this->items != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
      {
        operator_delete__(this->items);
      }
      this->items = pbVar7;
    }
    this->numAllocated = uVar9;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }